

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O0

int __thiscall ncnn::BatchNorm::load_model(BatchNorm *this,ModelBin *mb)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  undefined8 *in_RSI;
  Mat *in_RDI;
  float fVar4;
  double dVar5;
  float sqrt_var;
  int i;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Mat *in_stack_fffffffffffffea8;
  Mat *this_00;
  undefined1 *puVar6;
  int _w;
  int local_12c;
  Mat local_128;
  undefined1 local_e8 [64];
  undefined1 local_a8 [80];
  undefined1 local_58 [64];
  undefined8 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)*in_RSI)(local_58,in_RSI,*(undefined4 *)&in_RDI[2].data,1);
  Mat::operator=(in_stack_fffffffffffffea8,
                 (Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  Mat::~Mat((Mat *)0x13e681);
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  if (bVar2) {
    local_4 = -100;
  }
  else {
    puVar6 = local_a8;
    (**(code **)*local_18)(puVar6,local_18,*(undefined4 *)&in_RDI[2].data,1);
    _w = (int)((ulong)puVar6 >> 0x20);
    Mat::operator=(in_stack_fffffffffffffea8,
                   (Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Mat::~Mat((Mat *)0x13e720);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    if (bVar2) {
      local_4 = -100;
    }
    else {
      puVar6 = local_e8;
      (**(code **)*local_18)(puVar6,local_18,*(undefined4 *)&in_RDI[2].data,1);
      Mat::operator=(in_stack_fffffffffffffea8,
                     (Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      Mat::~Mat((Mat *)0x13e7bf);
      bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if (bVar2) {
        local_4 = -100;
      }
      else {
        this_00 = &local_128;
        (**(code **)*local_18)(this_00,local_18,*(undefined4 *)&in_RDI[2].data,1);
        Mat::operator=(this_00,(Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
        ;
        Mat::~Mat((Mat *)0x13e858);
        bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        if (bVar2) {
          local_4 = -100;
        }
        else {
          Mat::create(in_RDI,_w,(size_t)puVar6,(Allocator *)this_00);
          bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          if (bVar2) {
            local_4 = -100;
          }
          else {
            Mat::create(in_RDI,_w,(size_t)puVar6,(Allocator *)this_00);
            bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
            ;
            if (bVar2) {
              local_4 = -100;
            }
            else {
              for (local_12c = 0; local_12c < *(int *)&in_RDI[2].data; local_12c = local_12c + 1) {
                pfVar3 = Mat::operator[]((Mat *)&in_RDI[4].refcount,local_12c);
                dVar5 = std::sqrt((double)(ulong)(uint)(*pfVar3 +
                                                       *(float *)((long)&in_RDI[2].data + 4)));
                pfVar3 = Mat::operator[]((Mat *)&in_RDI[5].refcount,local_12c);
                fVar4 = *pfVar3;
                pfVar3 = Mat::operator[]((Mat *)&in_RDI[2].refcount,local_12c);
                fVar1 = *pfVar3;
                pfVar3 = Mat::operator[]((Mat *)&in_RDI[3].refcount,local_12c);
                fVar4 = fVar4 - (fVar1 * *pfVar3) / SUB84(dVar5,0);
                pfVar3 = Mat::operator[]((Mat *)&in_RDI[6].refcount,local_12c);
                *pfVar3 = fVar4;
                pfVar3 = Mat::operator[]((Mat *)&in_RDI[2].refcount,local_12c);
                fVar4 = *pfVar3 / SUB84(dVar5,0);
                pfVar3 = Mat::operator[]((Mat *)&in_RDI[7].refcount,local_12c);
                *pfVar3 = fVar4;
              }
              local_4 = 0;
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int BatchNorm::load_model(const ModelBin& mb)
{
    slope_data = mb.load(channels, 1);
    if (slope_data.empty())
        return -100;

    mean_data = mb.load(channels, 1);
    if (mean_data.empty())
        return -100;

    var_data = mb.load(channels, 1);
    if (var_data.empty())
        return -100;

    bias_data = mb.load(channels, 1);
    if (bias_data.empty())
        return -100;

    a_data.create(channels);
    if (a_data.empty())
        return -100;
    b_data.create(channels);
    if (b_data.empty())
        return -100;

    for (int i=0; i<channels; i++)
    {
        float sqrt_var = sqrt(var_data[i] + eps);
        a_data[i] = bias_data[i] - slope_data[i] * mean_data[i] / sqrt_var;
        b_data[i] = slope_data[i] / sqrt_var;
    }

    return 0;
}